

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DataTypeClamp(ImGuiDataType data_type,void *p_data,void *p_min,void *p_max)

{
  void *p_max_local;
  void *p_min_local;
  void *p_data_local;
  ImGuiDataType data_type_local;
  
  switch(data_type) {
  case 0:
    p_data_local._7_1_ = ClampBehaviorT<signed_char>((char *)p_data,*p_min,*p_max);
    break;
  case 1:
    p_data_local._7_1_ = ClampBehaviorT<unsigned_char>((uchar *)p_data,*p_min,*p_max);
    break;
  case 2:
    p_data_local._7_1_ = ClampBehaviorT<short>((short *)p_data,*p_min,*p_max);
    break;
  case 3:
    p_data_local._7_1_ = ClampBehaviorT<unsigned_short>((unsigned_short *)p_data,*p_min,*p_max);
    break;
  case 4:
    p_data_local._7_1_ = ClampBehaviorT<int>((int *)p_data,*p_min,*p_max);
    break;
  case 5:
    p_data_local._7_1_ = ClampBehaviorT<unsigned_int>((uint *)p_data,*p_min,*p_max);
    break;
  case 6:
    p_data_local._7_1_ = ClampBehaviorT<long_long>((longlong *)p_data,*p_min,*p_max);
    break;
  case 7:
    p_data_local._7_1_ =
         ClampBehaviorT<unsigned_long_long>((unsigned_long_long *)p_data,*p_min,*p_max);
    break;
  case 8:
    p_data_local._7_1_ = ClampBehaviorT<float>((float *)p_data,*p_min,*p_max);
    break;
  case 9:
    p_data_local._7_1_ = ClampBehaviorT<double>((double *)p_data,*p_min,*p_max);
    break;
  case 10:
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_widgets.cpp"
                  ,0x785,
                  "bool ImGui::DataTypeClamp(ImGuiDataType, void *, const void *, const void *)");
  }
  return p_data_local._7_1_;
}

Assistant:

bool ImGui::DataTypeClamp(ImGuiDataType data_type, void* p_data, const void* p_min, const void* p_max)
{
    switch (data_type)
    {
    case ImGuiDataType_S8:     return ClampBehaviorT<ImS8  >((ImS8*  )p_data, *(const ImS8*  )p_min, *(const ImS8*  )p_max);
    case ImGuiDataType_U8:     return ClampBehaviorT<ImU8  >((ImU8*  )p_data, *(const ImU8*  )p_min, *(const ImU8*  )p_max);
    case ImGuiDataType_S16:    return ClampBehaviorT<ImS16 >((ImS16* )p_data, *(const ImS16* )p_min, *(const ImS16* )p_max);
    case ImGuiDataType_U16:    return ClampBehaviorT<ImU16 >((ImU16* )p_data, *(const ImU16* )p_min, *(const ImU16* )p_max);
    case ImGuiDataType_S32:    return ClampBehaviorT<ImS32 >((ImS32* )p_data, *(const ImS32* )p_min, *(const ImS32* )p_max);
    case ImGuiDataType_U32:    return ClampBehaviorT<ImU32 >((ImU32* )p_data, *(const ImU32* )p_min, *(const ImU32* )p_max);
    case ImGuiDataType_S64:    return ClampBehaviorT<ImS64 >((ImS64* )p_data, *(const ImS64* )p_min, *(const ImS64* )p_max);
    case ImGuiDataType_U64:    return ClampBehaviorT<ImU64 >((ImU64* )p_data, *(const ImU64* )p_min, *(const ImU64* )p_max);
    case ImGuiDataType_Float:  return ClampBehaviorT<float >((float* )p_data, *(const float* )p_min, *(const float* )p_max);
    case ImGuiDataType_Double: return ClampBehaviorT<double>((double*)p_data, *(const double*)p_min, *(const double*)p_max);
    case ImGuiDataType_COUNT:  break;
    }
    IM_ASSERT(0);
    return false;
}